

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
floatFromString(Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *__return_storage_ptr__,string *s)

{
  char *__nptr;
  ulong uVar1;
  undefined8 uVar2;
  string local_68;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  float local_24;
  char *pcStack_20;
  float ret;
  char *endptr;
  string *s_local;
  
  pcStack_20 = (char *)0x0;
  endptr = (char *)s;
  s_local = (string *)__return_storage_ptr__;
  __nptr = (char *)std::__cxx11::string::c_str();
  local_24 = strtof(__nptr,&stack0xffffffffffffffe0);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) && (*pcStack_20 == '\0')) {
    Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_24);
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_68,"Cannot convert \'%s\' to float",uVar2);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_48,&local_68);
    Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_48);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<float, std::string> floatFromString(const std::string &s) {
		char *endptr = nullptr;
		const float ret = strtof(s.c_str(), &endptr);
		if (s.empty() || endptr[0] != '\0')
			return Unexpected(format("Cannot convert '%s' to float", s.c_str()));
		return ret;
}